

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.h
# Opt level: O2

bool __thiscall SQTable::GetStr(SQTable *this,SQChar *key,SQInteger keylen,SQObjectPtr *val)

{
  int iVar1;
  SQHash SVar2;
  _HashNode *p_Var3;
  SQObject local_38;
  
  SVar2 = _hashstr(key,keylen);
  p_Var3 = this->_nodes + (this->_numofnodes - 1U & SVar2);
  while (((p_Var3->key).super_SQObject._type != OT_STRING ||
         (iVar1 = strcmp((char *)&((p_Var3->key).super_SQObject._unVal.pOuter)->_idx,key),
         iVar1 != 0))) {
    p_Var3 = p_Var3->next;
    if (p_Var3 == (_HashNode *)0x0) {
      return false;
    }
  }
  if ((p_Var3->val).super_SQObject._type == OT_WEAKREF) {
    p_Var3 = (_HashNode *)
             &(((p_Var3->val).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              _next;
  }
  local_38._type = (p_Var3->val).super_SQObject._type;
  local_38._4_4_ = *(undefined4 *)&(p_Var3->val).super_SQObject.field_0x4;
  local_38._unVal = (p_Var3->val).super_SQObject._unVal;
  SQObjectPtr::operator=(val,&local_38);
  return true;
}

Assistant:

inline bool GetStr(const SQChar* key,SQInteger keylen,SQObjectPtr &val)
    {
        SQHash hash = _hashstr(key,keylen);
        _HashNode *n = &_nodes[hash & (_numofnodes - 1)];
        _HashNode *res = NULL;
        do{
            if(sq_type(n->key) == OT_STRING && (scstrcmp(_stringval(n->key),key) == 0)){
                res = n;
                break;
            }
        }while((n = n->next));
        if (res) {
            val = _realval(res->val);
            return true;
        }
        return false;
    }